

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void bits2int(uECC_word_t *native,uint8_t *bits,uint bits_size,uECC_Curve curve)

{
  ulong uVar1;
  wordcount_t num_words;
  cmpresult_t cVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  ulong *puVar6;
  uECC_word_t temp;
  uECC_word_t *ptr;
  uECC_word_t carry;
  int shift;
  uint num_n_words;
  uint num_n_bytes;
  uECC_Curve curve_local;
  uint bits_size_local;
  uint8_t *bits_local;
  uECC_word_t *native_local;
  
  uVar3 = (curve->num_n_bits + 7) / 8;
  uVar4 = (curve->num_n_bits + 0x3f) / 0x40;
  curve_local._4_4_ = bits_size;
  if (uVar3 < bits_size) {
    curve_local._4_4_ = uVar3;
  }
  num_words = (wordcount_t)uVar4;
  uECC_vli_clear(native,num_words);
  uECC_vli_bytesToNative(native,bits,curve_local._4_4_);
  if ((uint)(int)curve->num_n_bits < curve_local._4_4_ << 3) {
    bVar5 = (char)curve_local._4_4_ * '\b' - (char)curve->num_n_bits;
    ptr = (uECC_word_t *)0x0;
    temp = (uECC_word_t)(native + uVar4);
    while (puVar6 = (ulong *)(temp - 8), native < temp) {
      uVar1 = *puVar6;
      *puVar6 = uVar1 >> (bVar5 & 0x3f) | (ulong)ptr;
      ptr = (uECC_word_t *)(uVar1 << (0x40 - bVar5 & 0x3f));
      temp = (uECC_word_t)puVar6;
    }
    cVar2 = uECC_vli_cmp_unsafe(curve->n,native,num_words);
    if (cVar2 != '\x01') {
      uECC_vli_sub(native,native,curve->n,num_words);
    }
  }
  return;
}

Assistant:

static void bits2int(uECC_word_t *native,
                     const uint8_t *bits,
                     unsigned bits_size,
                     uECC_Curve curve) {
    unsigned num_n_bytes = BITS_TO_BYTES(curve->num_n_bits);
    unsigned num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    int shift;
    uECC_word_t carry;
    uECC_word_t *ptr;

    if (bits_size > num_n_bytes) {
        bits_size = num_n_bytes;
    }

    uECC_vli_clear(native, num_n_words);
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) native, bits, bits_size);
#else
    uECC_vli_bytesToNative(native, bits, bits_size);
#endif
    if (bits_size * 8 <= (unsigned)curve->num_n_bits) {
        return;
    }
    shift = bits_size * 8 - curve->num_n_bits;
    carry = 0;
    ptr = native + num_n_words;
    while (ptr-- > native) {
        uECC_word_t temp = *ptr;
        *ptr = (temp >> shift) | carry;
        carry = temp << (uECC_WORD_BITS - shift);
    }

    /* Reduce mod curve_n */
    if (uECC_vli_cmp_unsafe(curve->n, native, num_n_words) != 1) {
        uECC_vli_sub(native, native, curve->n, num_n_words);
    }
}